

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void trieste::logging::append<unsigned_long>(Log *self,unsigned_long *t)

{
  runtime_error *this;
  
  if (self->print != Silent) {
    std::ostream::_M_insert<unsigned_long>((ulong)((self->strstream).data + 0x10));
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Log should not be printed! Use should_print()");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool is_active()
    {
      return print != Status::Silent;
    }